

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void luaE_shrinkCI(lua_State *L)

{
  bool bVar1;
  CallInfo *local_20;
  CallInfo *next2;
  CallInfo *ci;
  lua_State *L_local;
  
  next2 = L->ci;
  while( true ) {
    bVar1 = false;
    if (next2->next != (CallInfo *)0x0) {
      local_20 = next2->next->next;
      bVar1 = local_20 != (CallInfo *)0x0;
    }
    if (!bVar1) break;
    luaM_realloc_(L,next2->next,0x48,0);
    L->nci = L->nci - 1;
    next2->next = local_20;
    local_20->previous = next2;
    next2 = local_20;
  }
  return;
}

Assistant:

void luaE_shrinkCI(lua_State *L) {
    CallInfo *ci = L->ci;
    CallInfo *next2;  /* next's next */
    /* while there are two nexts */
    while (ci->next != NULL && (next2 = ci->next->next) != NULL) {
        luaM_free(L, ci->next);  /* free next */
        L->nci--;
        ci->next = next2;  /* remove 'next' from the list */
        next2->previous = ci;
        ci = next2;  /* keep next's next */
    }
}